

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall
cmState::AddDisallowedCommand
          (cmState *this,string *name,BuiltinCommand command,PolicyID policy,char *message)

{
  anon_class_24_3_7a978329 local_68;
  Command local_50;
  char *local_30;
  char *message_local;
  BuiltinCommand p_Stack_20;
  PolicyID policy_local;
  BuiltinCommand command_local;
  string *name_local;
  cmState *this_local;
  
  local_68.command = command;
  local_68.policy = policy;
  local_68.message = message;
  local_30 = message;
  message_local._4_4_ = policy;
  p_Stack_20 = command;
  command_local = (BuiltinCommand)name;
  name_local = (string *)this;
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::
  function<cmState::AddDisallowedCommand(std::__cxx11::string_const&,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&),cmPolicies::PolicyID,char_const*)::__0,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_50,&local_68);
  AddBuiltinCommand(this,name,&local_50);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_50);
  return;
}

Assistant:

void cmState::AddDisallowedCommand(std::string const& name,
                                   BuiltinCommand command,
                                   cmPolicies::PolicyID policy,
                                   const char* message)
{
  this->AddBuiltinCommand(
    name,
    [command, policy, message](const std::vector<cmListFileArgument>& args,
                               cmExecutionStatus& status) -> bool {
      cmMakefile& mf = status.GetMakefile();
      switch (mf.GetPolicyStatus(policy)) {
        case cmPolicies::WARN:
          mf.IssueMessage(MessageType::AUTHOR_WARNING,
                          cmPolicies::GetPolicyWarning(policy));
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          mf.IssueMessage(MessageType::FATAL_ERROR, message);
          return true;
      }
      return InvokeBuiltinCommand(command, args, status);
    });
}